

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_from_quat(mat4 *__return_storage_ptr__,quat q)

{
  float w;
  float z;
  float y;
  float x;
  quat q_local;
  
  y = q.x;
  x = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  mat4_create(__return_storage_ptr__,-(q_local.x * 2.0) * q_local.x + -(x * 2.0) * x + 1.0,
              y * 2.0 * x + -(q_local.y * 2.0 * q_local.x),y * 2.0 * q_local.x + q_local.y * 2.0 * x
              ,0.0,y * 2.0 * x + q_local.y * 2.0 * q_local.x,
              -(q_local.x * 2.0) * q_local.x + -(y * 2.0) * y + 1.0,
              x * 2.0 * q_local.x + -(q_local.y * 2.0 * y),0.0,
              y * 2.0 * q_local.x + -(q_local.y * 2.0 * x),x * 2.0 * q_local.x + q_local.y * 2.0 * y
              ,-(x * 2.0) * x + -(y * 2.0) * y + 1.0,0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_from_quat(quat q) {
    float x = q.x;
    float y = q.y;
    float z = q.z;
    float w = q.w;

    return mat4_create(
            1.0f - 2.0f * y * y - 2.0f * z * z, 2.0f * x * y - 2.0f * w * z, 2.0f * x * z + 2.0f * w * y,
            0.0f,
            2.0f * x * y + 2.0f * w * z, 1.0f - 2.0f * x * x - 2.0f * z * z, 2.0f * y * z - 2.0f * w * x,
            0.0f,
            2.0f * x * z - 2.0f * w * y, 2.0f * y * z + 2.0f * w * x, 1.0f - 2.0f * x * x - 2.0f * y * y,
            0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}